

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkRenderingAttachmentLocationInfoKHR *info,ScratchAllocator *alloc)

{
  void *pvVar1;
  undefined8 uVar2;
  uint32_t *puVar3;
  undefined8 *puVar4;
  void *__dest;
  size_t size;
  
  puVar4 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (puVar4 != (undefined8 *)0x0) {
    uVar2 = *(undefined8 *)info;
    pvVar1 = info->pNext;
    puVar3 = info->pColorAttachmentLocations;
    puVar4[2] = *(undefined8 *)&info->colorAttachmentCount;
    puVar4[3] = puVar3;
    *puVar4 = uVar2;
    puVar4[1] = pvVar1;
  }
  pvVar1 = (void *)puVar4[3];
  if (pvVar1 != (void *)0x0) {
    if ((ulong)info->colorAttachmentCount == 0) {
      __dest = (void *)0x0;
    }
    else {
      size = (ulong)info->colorAttachmentCount << 2;
      __dest = ScratchAllocator::allocate_raw(alloc,size,0x10);
      if (__dest != (void *)0x0) {
        memmove(__dest,pvVar1,size);
      }
    }
    puVar4[3] = __dest;
  }
  return puVar4;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkRenderingAttachmentLocationInfoKHR *info, ScratchAllocator &alloc)
{
	auto *loc_info = copy(info, 1, alloc);
	if (loc_info->pColorAttachmentLocations)
		loc_info->pColorAttachmentLocations = copy(loc_info->pColorAttachmentLocations, info->colorAttachmentCount, alloc);
	return loc_info;
}